

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O1

void more_experienced(int exp,int score,int rexp)

{
  int iVar1;
  
  u.uexp = u.uexp + exp;
  u.urexp = rexp + exp * 4 + u.urexp;
  u.urscore = u.urscore + rexp + score * 4;
  iflags.botl = '\x01';
  iVar1 = 2000;
  if (urole.malenum == 0x168) {
    iVar1 = 1000;
  }
  if (iVar1 <= u.urexp) {
    flags.beginner = '\0';
  }
  return;
}

Assistant:

void more_experienced(int exp, int score, int rexp)
{
	u.uexp += exp;
	u.urexp += 4*exp + rexp;
	u.urscore += 4*score + rexp;
	iflags.botl = 1;
	if (u.urexp >= (Role_if (PM_WIZARD) ? 1000 : 2000))
		flags.beginner = 0;
}